

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_manager.cpp
# Opt level: O1

void __thiscall duckdb::DatabaseManager::~DatabaseManager(DatabaseManager *this)

{
  pointer pcVar1;
  _Tuple_impl<0UL,_duckdb::AttachedDatabase_*,_std::default_delete<duckdb::AttachedDatabase>_> _Var2
  ;
  pointer *__ptr;
  
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&(this->db_paths)._M_h);
  pcVar1 = (this->default_database)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->default_database).field_2) {
    operator_delete(pcVar1);
  }
  ::std::unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>::~unique_ptr
            (&(this->databases).
              super_unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>_>);
  _Var2.super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>._M_head_impl =
       (this->system).
       super_unique_ptr<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::AttachedDatabase_*,_std::default_delete<duckdb::AttachedDatabase>_>
       .super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>;
  if (_Var2.super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>._M_head_impl !=
      (AttachedDatabase *)0x0) {
    (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false>.
                          _M_head_impl + 8))();
  }
  (this->system).
  super_unique_ptr<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>._M_t.
  super___uniq_ptr_impl<duckdb::AttachedDatabase,_std::default_delete<duckdb::AttachedDatabase>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::AttachedDatabase_*,_std::default_delete<duckdb::AttachedDatabase>_>
  .super__Head_base<0UL,_duckdb::AttachedDatabase_*,_false> =
       (_Head_base<0UL,_duckdb::AttachedDatabase_*,_false>)0x0;
  return;
}

Assistant:

DatabaseManager::~DatabaseManager() {
}